

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf-cursor.c
# Opt level: O3

int read_array(coda_cursor *cursor,void *dst)

{
  ushort *puVar1;
  ulong uVar2;
  undefined4 uVar3;
  coda_dynamic_type_struct *pcVar4;
  coda_product_struct *pcVar5;
  coda_type *pcVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [11];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  int iVar33;
  long lVar34;
  char *pcVar35;
  void *dst_00;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  
  pcVar4 = cursor->stack[(long)cursor->n + -1].type;
  pcVar5 = cursor->product;
  pcVar6 = pcVar4[1].definition;
  lVar34 = (*(long *)(*(long *)&pcVar6->type_class + 0x20) >> 3) *
           *(long *)&pcVar4->definition[1].type_class;
  if ((int)pcVar6->bit_size == 0) {
    iVar33 = read_bytes((coda_product *)pcVar5[1].filename,(int64_t)pcVar6->description,lVar34,dst);
    if (iVar33 != 0) {
      return -1;
    }
  }
  else {
    pcVar7 = pcVar4->definition[1].description;
    lVar34 = lVar34 / (long)pcVar7;
    if (0 < (long)pcVar7) {
      pcVar35 = (char *)0x0;
      dst_00 = dst;
      do {
        iVar33 = read_bytes((coda_product *)pcVar5[1].filename,
                            (int64_t)((pcVar4[1].definition)->description +
                                     *(long *)&pcVar5[1].format * (long)pcVar35),lVar34,dst_00);
        if (iVar33 != 0) {
          return -1;
        }
        pcVar35 = pcVar35 + 1;
        dst_00 = (void *)((long)dst_00 + lVar34);
      } while (pcVar7 != pcVar35);
    }
  }
  lVar34 = *(long *)(*(long *)&(pcVar4[1].definition)->type_class + 0x20);
  switch(lVar34 << 0x3d | lVar34 - 8U >> 3) {
  case 0:
    break;
  case 1:
    lVar8._0_4_ = pcVar4->definition[1].type_class;
    lVar8._4_4_ = pcVar4->definition[1].read_type;
    if (0 < lVar8) {
      lVar34 = 0;
      do {
        puVar1 = (ushort *)((long)dst + lVar34 * 2);
        *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
        lVar34 = lVar34 + 1;
        lVar9._0_4_ = pcVar4->definition[1].type_class;
        lVar9._4_4_ = pcVar4->definition[1].read_type;
      } while (lVar34 < lVar9);
    }
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-netcdf-cursor.c"
                  ,0x106,"int read_array(const coda_cursor *, void *)");
  case 3:
    lVar10._0_4_ = pcVar4->definition[1].type_class;
    lVar10._4_4_ = pcVar4->definition[1].read_type;
    if (0 < lVar10) {
      lVar34 = 0;
      do {
        uVar3 = *(undefined4 *)((long)dst + lVar34 * 4);
        auVar36._8_8_ = 0;
        auVar36._0_8_ =
             (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)uVar3 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar3 >> 0x10),uVar3)) >>
                                                  0x20),uVar3) >> 0x18),
                                             CONCAT12((char)((uint)uVar3 >> 8),(short)uVar3)) >>
                                   0x10),(short)uVar3) & 0xffff00ff00ff00ff;
        auVar37 = pshuflw(auVar36,auVar36,0x1b);
        sVar13 = auVar37._0_2_;
        sVar14 = auVar37._2_2_;
        sVar15 = auVar37._4_2_;
        sVar16 = auVar37._6_2_;
        *(uint *)((long)dst + lVar34 * 4) =
             CONCAT13((0 < sVar16) * (sVar16 < 0x100) * auVar37[6] - (0xff < sVar16),
                      CONCAT12((0 < sVar15) * (sVar15 < 0x100) * auVar37[4] - (0xff < sVar15),
                               CONCAT11((0 < sVar14) * (sVar14 < 0x100) * auVar37[2] -
                                        (0xff < sVar14),
                                        (0 < sVar13) * (sVar13 < 0x100) * auVar37[0] -
                                        (0xff < sVar13))));
        lVar34 = lVar34 + 1;
        lVar11._0_4_ = pcVar4->definition[1].type_class;
        lVar11._4_4_ = pcVar4->definition[1].read_type;
      } while (lVar34 < lVar11);
    }
    break;
  case 7:
    lVar34._0_4_ = pcVar4->definition[1].type_class;
    lVar34._4_4_ = pcVar4->definition[1].read_type;
    if (0 < lVar34) {
      lVar34 = 0;
      do {
        uVar2 = *(ulong *)((long)dst + lVar34 * 8);
        auVar21._8_6_ = 0;
        auVar21._0_8_ = uVar2;
        auVar21[0xe] = (char)(uVar2 >> 0x38);
        auVar22._8_4_ = 0;
        auVar22._0_8_ = uVar2;
        auVar22[0xc] = (char)(uVar2 >> 0x30);
        auVar22._13_2_ = auVar21._13_2_;
        auVar23._8_4_ = 0;
        auVar23._0_8_ = uVar2;
        auVar23._12_3_ = auVar22._12_3_;
        auVar24._8_2_ = 0;
        auVar24._0_8_ = uVar2;
        auVar24[10] = (char)(uVar2 >> 0x28);
        auVar24._11_4_ = auVar23._11_4_;
        auVar25._8_2_ = 0;
        auVar25._0_8_ = uVar2;
        auVar25._10_5_ = auVar24._10_5_;
        auVar26[8] = (char)(uVar2 >> 0x20);
        auVar26._0_8_ = uVar2;
        auVar26._9_6_ = auVar25._9_6_;
        auVar37[7] = 0;
        auVar37._0_7_ = auVar26._8_7_;
        auVar29._7_8_ = 0;
        auVar29._0_7_ = auVar26._8_7_;
        auVar31._1_8_ = SUB158(auVar29 << 0x40,7);
        auVar31[0] = (char)(uVar2 >> 0x18);
        auVar31._9_6_ = 0;
        auVar30._1_10_ = SUB1510(auVar31 << 0x30,5);
        auVar30[0] = (char)(uVar2 >> 0x10);
        auVar32._11_4_ = 0;
        auVar32._0_11_ = auVar30;
        auVar27[2] = (char)(uVar2 >> 8);
        auVar27._0_2_ = (ushort)uVar2;
        auVar27._3_12_ = SUB1512(auVar32 << 0x20,3);
        auVar28._2_13_ = auVar27._2_13_;
        auVar28._0_2_ = (ushort)uVar2 & 0xff;
        auVar37._8_4_ = auVar28._0_4_;
        auVar37._12_4_ = auVar30._0_4_;
        auVar37 = pshuflw(auVar37,auVar37,0x1b);
        auVar37 = pshufhw(auVar37,auVar37,0x1b);
        sVar13 = auVar37._0_2_;
        sVar14 = auVar37._2_2_;
        sVar15 = auVar37._4_2_;
        sVar16 = auVar37._6_2_;
        sVar17 = auVar37._8_2_;
        sVar18 = auVar37._10_2_;
        sVar19 = auVar37._12_2_;
        sVar20 = auVar37._14_2_;
        *(ulong *)((long)dst + lVar34 * 8) =
             CONCAT17((0 < sVar20) * (sVar20 < 0x100) * auVar37[0xe] - (0xff < sVar20),
                      CONCAT16((0 < sVar19) * (sVar19 < 0x100) * auVar37[0xc] - (0xff < sVar19),
                               CONCAT15((0 < sVar18) * (sVar18 < 0x100) * auVar37[10] -
                                        (0xff < sVar18),
                                        CONCAT14((0 < sVar17) * (sVar17 < 0x100) * auVar37[8] -
                                                 (0xff < sVar17),
                                                 CONCAT13((0 < sVar16) * (sVar16 < 0x100) *
                                                          auVar37[6] - (0xff < sVar16),
                                                          CONCAT12((0 < sVar15) * (sVar15 < 0x100) *
                                                                   auVar37[4] - (0xff < sVar15),
                                                                   CONCAT11((0 < sVar14) *
                                                                            (sVar14 < 0x100) *
                                                                            auVar37[2] -
                                                                            (0xff < sVar14),
                                                                            (0 < sVar13) *
                                                                            (sVar13 < 0x100) *
                                                                            auVar37[0] -
                                                                            (0xff < sVar13))))))));
        lVar34 = lVar34 + 1;
        lVar12._0_4_ = pcVar4->definition[1].type_class;
        lVar12._4_4_ = pcVar4->definition[1].read_type;
      } while (lVar34 < lVar12);
    }
  }
  return 0;
}

Assistant:

static int read_array(const coda_cursor *cursor, void *dst)
{
    coda_cdf_variable *variable = (coda_cdf_variable *)cursor->stack[cursor->n - 1].type;
    coda_type_class type_class;
    long record_size = variable->num_values_per_record * variable->value_size;
    int i;

    assert(variable->tag == tag_cdf_variable);
    if (variable->base_type == NULL)
    {
        type_class = variable->definition->type_class;
    }
    else
    {
        type_class = variable->base_type->definition->type_class;
    }

    for (i = 0; i < variable->num_records; i++)
    {
        /* TODO: handle sparse records */
        if (variable->offset[i] < 0)
        {
            coda_set_error(CODA_ERROR_UNSUPPORTED_PRODUCT, "Missing record not supported for CDF variable");
            return -1;
        }
        if (variable->data != NULL)
        {
            memcpy(&((uint8_t *)dst)[i * record_size], &variable->data[variable->offset[i]], record_size);
        }
        else
        {
            if (read_bytes(((coda_cdf_product *)cursor->product)->raw_product, variable->offset[i], record_size,
                           &((uint8_t *)dst)[i * record_size]) != 0)
            {
                return -1;
            }
        }
    }
    if (type_class != coda_text_class)
    {
#ifdef WORDS_BIGENDIAN
        coda_endianness system_endianness = coda_big_endian;
#else
        coda_endianness system_endianness = coda_little_endian;
#endif
        if (((coda_cdf_product *)cursor->product)->endianness != system_endianness)
        {
            switch (variable->value_size)
            {
                case 1:
                    break;
                case 2:
                    for (i = 0; i < variable->num_records * variable->num_values_per_record; i++)
                    {
                        swap2(&((int16_t *)dst)[i]);
                    }
                    break;
                case 4:
                    for (i = 0; i < variable->num_records * variable->num_values_per_record; i++)
                    {
                        swap4(&((int32_t *)dst)[i]);
                    }
                    break;
                case 8:
                    for (i = 0; i < variable->num_records * variable->num_values_per_record; i++)
                    {
                        swap8(&((int64_t *)dst)[i]);
                    }
                    break;
                default:
                    assert(0);
                    exit(1);
            }
        }
    }

    return 0;
}